

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b3D_integrator.cpp
# Opt level: O1

void __thiscall NetworkNS::cb3D_integrator::cell_density_nodal_points(cb3D_integrator *this)

{
  int *piVar1;
  size_t __size;
  double *pdVar2;
  Domain *pDVar3;
  int iVar4;
  void *__s;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  double xnew;
  double znew;
  double ynew;
  double local_48;
  double local_40;
  double local_38;
  
  lVar6 = (long)this->cur_bd_net->grid->ncells;
  __size = lVar6 * 4;
  __s = malloc(__size);
  if (0 < lVar6) {
    memset(__s,0,__size);
  }
  if (this->dofs != 0) {
    uVar5 = 2;
    uVar7 = 0;
    do {
      pdVar2 = this->bd_x;
      local_48 = pdVar2[uVar5 - 2];
      local_38 = pdVar2[uVar5 - 1];
      local_40 = pdVar2[uVar5];
      Domain::minimum_image(this->cur_bd_net->domain,&local_48,&local_38,&local_40);
      pDVar3 = this->cur_bd_net->domain;
      local_48 = pDVar3->XBoxLen * 0.5 + local_48;
      local_38 = pDVar3->YBoxLen * 0.5 + local_38;
      local_40 = pDVar3->ZBoxLen * 0.5 + local_40;
      iVar4 = Grid::find_grid_cell(this->cur_bd_net->grid,&local_48,&local_38,&local_40);
      piVar1 = (int *)((long)__s + (long)iVar4 * 4);
      *piVar1 = *piVar1 + 1;
      uVar7 = uVar7 + 1;
      uVar5 = uVar5 + 3;
    } while (uVar7 < this->dofs);
  }
  if (0 < this->cur_bd_net->grid->ncells) {
    uVar7 = 0;
    do {
      fprintf((FILE *)this->p_cell_density,"%d  %d\n",uVar7 & 0xffffffff,
              (ulong)*(uint *)((long)__s + uVar7 * 4));
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 < (long)this->cur_bd_net->grid->ncells);
  }
  return;
}

Assistant:

void cb3D_integrator::cell_density_nodal_points() {

      double xnew, ynew, znew;
      int Id;
      int *hist_grid = (int*) malloc(cur_bd_net->grid->ncells * sizeof (int));

      for (int i = 0; i < cur_bd_net->grid->ncells; i++)
         hist_grid[i] = 0;

      for (unsigned int inode = 0; inode < dofs; inode++) {

         xnew = bd_x[3 * inode + 0];
         ynew = bd_x[3 * inode + 1];
         znew = bd_x[3 * inode + 2];
         cur_bd_net->domain->minimum_image(xnew, ynew, znew);
         xnew = xnew + cur_bd_net->domain->XBoxLen / 2.0;
         ynew = ynew + cur_bd_net->domain->YBoxLen / 2.0;
         znew = znew + cur_bd_net->domain->ZBoxLen / 2.0;
         Id = cur_bd_net->grid->find_grid_cell(xnew, ynew, znew);
         hist_grid[Id] = hist_grid[Id] + 1;

      }

      for (int i = 0; i < cur_bd_net->grid->ncells; i++)
         fprintf(p_cell_density, "%d " " %d\n", i, hist_grid[i]);

      return;
   }